

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

PrintStatement * __thiscall Parser::printStmt(Parser *this)

{
  bool bVar1;
  bool *pbVar2;
  PrintStatement *printStatement;
  undefined1 local_160 [8];
  Token tok;
  Testlist *list;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_88 [8];
  Token printKeyword;
  Parser *this_local;
  
  printKeyword._string.field_2._8_8_ = this;
  Tokenizer::getToken((Token *)local_88,this->tokenizer);
  bVar1 = Token::isPrint((Token *)local_88);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Parser::printStmt",&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Expected a name token, instead got",
               (allocator<char> *)((long)&list + 7));
    die(this,&local_b8,&local_e0,(Token *)local_88);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&list + 7));
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  tok._string.field_2._8_8_ = 0;
  Tokenizer::getToken((Token *)local_160,this->tokenizer);
  pbVar2 = Token::eol((Token *)local_160);
  if ((*pbVar2 & 1U) == 0) {
    Tokenizer::ungetToken(this->tokenizer);
    tok._string.field_2._8_8_ = testList(this);
    this_local = (Parser *)operator_new(0x68);
    PrintStatement::PrintStatement
              ((PrintStatement *)this_local,(Testlist *)tok._string.field_2._8_8_);
  }
  else {
    Tokenizer::ungetToken(this->tokenizer);
    this_local = (Parser *)0x0;
  }
  Token::~Token((Token *)local_160);
  Token::~Token((Token *)local_88);
  return (PrintStatement *)this_local;
}

Assistant:

PrintStatement *Parser::printStmt() {
    //'print' [ testlist ]


    Token printKeyword = tokenizer.getToken();
    if (!printKeyword.isPrint())
        die("Parser::printStmt", "Expected a name token, instead got", printKeyword);
    Testlist *list = nullptr;
    Token tok = tokenizer.getToken();

    if (!tok.eol()) {
        tokenizer.ungetToken();
        list = testList();
    } else{
        tokenizer.ungetToken();
        return nullptr;
    }
    auto *printStatement = new PrintStatement(list);
    return printStatement;
}